

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O0

unique_ptr<S2Shape,_std::default_delete<S2Shape>_> __thiscall
s2shapeutil::TaggedShapeFactory::operator[](TaggedShapeFactory *this,int shape_id)

{
  bool bVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  uint local_3c;
  undefined1 local_38 [4];
  TypeTag tag;
  Decoder decoder;
  int shape_id_local;
  TaggedShapeFactory *this_local;
  
  s2coding::EncodedStringVector::GetDecoder
            ((Decoder *)local_38,
             (EncodedStringVector *)(CONCAT44(in_register_00000034,shape_id) + 0x28),in_EDX);
  bVar1 = Decoder::get_varint32((Decoder *)local_38,&local_3c);
  if (bVar1) {
    std::function<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(unsigned_int,_Decoder_*)>
    ::operator()((function<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(unsigned_int,_Decoder_*)>
                  *)this,shape_id + 8,(Decoder *)(ulong)local_3c);
  }
  else {
    std::unique_ptr<S2Shape,std::default_delete<S2Shape>>::
    unique_ptr<std::default_delete<S2Shape>,void>
              ((unique_ptr<S2Shape,std::default_delete<S2Shape>> *)this,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<S2Shape,_std::default_delete<S2Shape>,_true,_true>)
         (__uniq_ptr_data<S2Shape,_std::default_delete<S2Shape>,_true,_true>)this;
}

Assistant:

unique_ptr<S2Shape> TaggedShapeFactory::operator[](int shape_id) const {
  Decoder decoder = encoded_shapes_.GetDecoder(shape_id);
  S2Shape::TypeTag tag;
  if (!decoder.get_varint32(&tag)) return nullptr;
  return shape_decoder_(tag, &decoder);
}